

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::TrendGroup::append
          (TrendGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  Type TVar2;
  TrendGroup *in_RDI;
  optional<metaf::TrendGroup> nextGroup;
  ReportMetadata *in_stack_00000130;
  ReportPart in_stack_0000013c;
  string *in_stack_00000140;
  TrendGroup *in_stack_ffffffffffffff88;
  undefined4 local_4;
  
  TVar2 = type(in_RDI);
  if (TVar2 == NOSIG) {
    local_4 = NOT_APPENDED;
  }
  else {
    parse(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
    bVar1 = std::optional<metaf::TrendGroup>::has_value((optional<metaf::TrendGroup> *)0x23eb80);
    if (bVar1) {
      std::optional<metaf::TrendGroup>::operator*((optional<metaf::TrendGroup> *)0x23eb9e);
      bVar1 = combineProbAndTrendTypeGroups(in_stack_ffffffffffffff88,in_RDI);
      if (bVar1) {
        local_4 = APPENDED;
      }
      else {
        std::optional<metaf::TrendGroup>::operator*((optional<metaf::TrendGroup> *)0x23ebcb);
        bVar1 = combineTrendTypeAndTimeGroup(in_stack_ffffffffffffff88,in_RDI);
        if (bVar1) {
          local_4 = APPENDED;
        }
        else {
          std::optional<metaf::TrendGroup>::operator*((optional<metaf::TrendGroup> *)0x23ebf5);
          bVar1 = combineProbAndTimeSpanGroups(in_stack_ffffffffffffff88,in_RDI);
          if (bVar1) {
            local_4 = APPENDED;
          }
          else {
            std::optional<metaf::TrendGroup>::operator*((optional<metaf::TrendGroup> *)0x23ec1f);
            bVar1 = combineIncompleteGroups(in_stack_ffffffffffffff88,in_RDI);
            if (bVar1) {
              local_4 = APPENDED;
            }
            else {
              local_4 = NOT_APPENDED;
            }
          }
        }
      }
    }
    else {
      local_4 = NOT_APPENDED;
    }
  }
  return local_4;
}

Assistant:

AppendResult TrendGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (type() == Type::NOSIG) return AppendResult::NOT_APPENDED;
	const auto nextGroup = parse(group, reportPart, reportMetadata);
	if (!nextGroup.has_value()) return AppendResult::NOT_APPENDED;
	if (combineProbAndTrendTypeGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineTrendTypeAndTimeGroup(*nextGroup)) return AppendResult::APPENDED;
	if (combineProbAndTimeSpanGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineIncompleteGroups(*nextGroup)) return AppendResult::APPENDED;
	return AppendResult::NOT_APPENDED;
}